

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dxil_ags.cpp
# Opt level: O2

Id dxil_spv::emit_coopmat_transpose(Impl *impl,Id v,uint32_t input_imm,uint32_t output_imm)

{
  uint uVar1;
  Id IVar2;
  Id IVar3;
  Id arg;
  uint uVar4;
  Builder *this;
  Operation *pOVar5;
  LoggingCallback p_Var6;
  Operation *pOVar7;
  void *pvVar8;
  char *__ptr;
  size_t sStack_1050;
  char buffer [4096];
  
  this = Converter::Impl::builder(impl);
  if (((input_imm & 0x70) != 0) && ((input_imm & 0xf) == 10 && (output_imm & 0x70) != 0)) {
    IVar2 = build_coopmat_type(impl,input_imm);
    IVar3 = build_coopmat_type(impl,output_imm);
    buffer[4] = (char)IVar3;
    buffer[5] = (char)(IVar3 >> 8);
    buffer[6] = (char)(IVar3 >> 0x10);
    buffer[7] = (char)(IVar3 >> 0x18);
    buffer[0] = (char)IVar2;
    buffer[1] = (char)(IVar2 >> 8);
    buffer[2] = (char)(IVar2 >> 0x10);
    buffer[3] = (char)(IVar2 >> 0x18);
    buffer[8] = '\0';
    buffer[9] = '\0';
    buffer[10] = '\0';
    buffer[0xb] = '\0';
    arg = SPIRVModule::get_helper_call_id(impl->spirv_module,CoopMatTransfer,(Id *)buffer,2);
    IVar2 = Converter::Impl::create_variable(impl,StorageClassFunction,IVar2,(char *)0x0);
    pOVar5 = Converter::Impl::allocate(impl,OpStore);
    Operation::add_id(pOVar5,IVar2);
    Operation::add_id(pOVar5,v);
    Converter::Impl::add(impl,pOVar5,false);
    pOVar5 = Converter::Impl::allocate(impl,OpFunctionCall,IVar3);
    Operation::add_id(pOVar5,arg);
    Operation::add_id(pOVar5,IVar2);
    Converter::Impl::add(impl,pOVar5,false);
    return pOVar5->id;
  }
  if ((impl->ags).coopmat_transpose_scratch == 0) {
    IVar2 = spv::Builder::makeUintType(this,0x20);
    uVar1 = (impl->execution_mode_meta).wave_size_min;
    uVar4 = (impl->execution_mode_meta).workgroup_threads[1] *
            (impl->execution_mode_meta).workgroup_threads[0] *
            (impl->execution_mode_meta).workgroup_threads[2];
    if ((uVar1 == 0) && (uVar1 = (impl->options).subgroup_size.implementation_minimum, uVar1 == 0))
    {
      p_Var6 = get_thread_log_callback();
      if (p_Var6 != (LoggingCallback)0x0) {
        memcpy(buffer,
               "Need LDS transpose, but there is no estimate for how large the LDS buffer needs to be.\n"
               ,0x58);
LAB_0016de0e:
        pvVar8 = get_thread_log_callback_userdata();
        (*p_Var6)(pvVar8,Error,buffer);
        return 0;
      }
      __ptr = 
      "[ERROR]: Need LDS transpose, but there is no estimate for how large the LDS buffer needs to be.\n"
      ;
      sStack_1050 = 0x60;
    }
    else {
      if (uVar1 <= uVar4) {
        IVar3 = spv::Builder::makeUintConstant(this,uVar4 / uVar1 << 8,false);
        IVar2 = spv::Builder::makeArrayType(this,IVar2,IVar3,0);
        IVar2 = Converter::Impl::create_variable
                          (impl,StorageClassWorkgroup,IVar2,"LDSTransposeScratch");
        (impl->ags).coopmat_transpose_scratch = IVar2;
        goto LAB_0016db3f;
      }
      p_Var6 = get_thread_log_callback();
      if (p_Var6 != (LoggingCallback)0x0) {
        builtin_strncpy(buffer + 0x10,"p size.\n",9);
        builtin_strncpy(buffer,"Invalid workgrou",0x10);
        goto LAB_0016de0e;
      }
      __ptr = "[ERROR]: Invalid workgroup size.\n";
      sStack_1050 = 0x21;
    }
    fwrite(__ptr,sStack_1050,1,_stderr);
    fflush(_stderr);
    return 0;
  }
LAB_0016db3f:
  if ((input_imm & 0xf) == 6 || (input_imm & 0xf) != (output_imm & 0xf)) {
    return 0;
  }
  IVar2 = SPIRVModule::get_builtin_shader_input(impl->spirv_module,BuiltInSubgroupId);
  IVar3 = spv::Builder::makeUintType(this,0x20);
  pOVar5 = Converter::Impl::allocate(impl,OpLoad,IVar3);
  Operation::add_id(pOVar5,IVar2);
  Converter::Impl::add(impl,pOVar5,false);
  IVar2 = spv::Builder::makeUintType(this,0x20);
  pOVar7 = Converter::Impl::allocate(impl,OpIMul,IVar2);
  Operation::add_id(pOVar7,pOVar5->id);
  IVar2 = spv::Builder::makeUintConstant(this,0x100,false);
  Operation::add_id(pOVar7,IVar2);
  Converter::Impl::add(impl,pOVar7,false);
  IVar2 = spv::Builder::makeUintType(this,0x20);
  IVar2 = spv::Builder::makePointer(this,StorageClassWorkgroup,IVar2);
  pOVar5 = Converter::Impl::allocate(impl,OpInBoundsAccessChain,IVar2);
  Operation::add_id(pOVar5,(impl->ags).coopmat_transpose_scratch);
  Operation::add_id(pOVar5,pOVar7->id);
  Converter::Impl::add(impl,pOVar5,false);
  pOVar7 = Converter::Impl::allocate(impl,OpControlBarrier);
  IVar2 = spv::Builder::makeUintConstant(this,3,false);
  Operation::add_id(pOVar7,IVar2);
  IVar2 = spv::Builder::makeUintConstant(this,2,false);
  Operation::add_id(pOVar7,IVar2);
  IVar2 = spv::Builder::makeUintConstant(this,0x108,false);
  Operation::add_id(pOVar7,IVar2);
  Converter::Impl::add(impl,pOVar7,false);
  pOVar7 = Converter::Impl::allocate(impl,OpCooperativeMatrixStoreKHR);
  Operation::add_id(pOVar7,pOVar5->id);
  Operation::add_id(pOVar7,v);
  IVar2 = spv::Builder::makeUintConstant(this,1,false);
  Operation::add_id(pOVar7,IVar2);
  IVar2 = spv::Builder::makeUintConstant(this,0x10,false);
  Operation::add_id(pOVar7,IVar2);
  Converter::Impl::add(impl,pOVar7,false);
  pOVar7 = Converter::Impl::allocate(impl,OpControlBarrier);
  IVar2 = spv::Builder::makeUintConstant(this,3,false);
  Operation::add_id(pOVar7,IVar2);
  IVar2 = spv::Builder::makeUintConstant(this,2,false);
  Operation::add_id(pOVar7,IVar2);
  IVar2 = spv::Builder::makeUintConstant(this,0x108,false);
  Operation::add_id(pOVar7,IVar2);
  Converter::Impl::add(impl,pOVar7,false);
  IVar2 = build_coopmat_type(impl,output_imm);
  if (IVar2 != 0) {
    pOVar7 = Converter::Impl::allocate(impl,OpCooperativeMatrixLoadKHR,IVar2);
    Operation::add_id(pOVar7,pOVar5->id);
    IVar2 = spv::Builder::makeUintConstant(this,1,false);
    Operation::add_id(pOVar7,IVar2);
    IVar2 = spv::Builder::makeUintConstant(this,0x10,false);
    Operation::add_id(pOVar7,IVar2);
    Converter::Impl::add(impl,pOVar7,false);
    return pOVar7->id;
  }
  return 0;
}

Assistant:

static spv::Id emit_coopmat_transpose(Converter::Impl &impl, spv::Id v, uint32_t input_imm, uint32_t output_imm)
{
	auto &builder = impl.builder();

	if (get_matrix_type(input_imm) != AmdExtD3DShaderIntrinsicsWaveMatrixType_A &&
	    get_matrix_type(output_imm) != AmdExtD3DShaderIntrinsicsWaveMatrixType_A &&
	    get_type_data_format(input_imm) == AmdExtD3DShaderIntrinsicsWaveMatrixDataFormat_FP8)
	{
		// It appears that in the cases we care about, layout of B and C are the same.
		// Just do element-wise copy here to avoid the bad roundtrip.
		// This assumption only seems to hold for FP8, but that's the only case we care about.
		return emit_coopmat_transfer(impl, v, input_imm, output_imm);
	}

	if (!impl.ags.coopmat_transpose_scratch)
	{
		spv::Id lds_type_id = builder.makeUintType(32);
		uint32_t num_elements = 16 * 16;

		// Assume that the workgroup is aligned.
		uint32_t max_num_workgroups = impl.execution_mode_meta.workgroup_threads[0] *
		                              impl.execution_mode_meta.workgroup_threads[1] *
		                              impl.execution_mode_meta.workgroup_threads[2];

		if (impl.execution_mode_meta.wave_size_min)
			max_num_workgroups /= impl.execution_mode_meta.wave_size_min;
		else if (impl.options.subgroup_size.implementation_minimum)
			max_num_workgroups /= impl.options.subgroup_size.implementation_minimum;
		else
		{
			LOGE("Need LDS transpose, but there is no estimate for how large the LDS buffer needs to be.\n");
			return 0;
		}

		if (!max_num_workgroups)
		{
			LOGE("Invalid workgroup size.\n");
			return 0;
		}

		num_elements *= max_num_workgroups;

		lds_type_id = builder.makeArrayType(lds_type_id, builder.makeUintConstant(num_elements), 0);
		impl.ags.coopmat_transpose_scratch =
		    impl.create_variable(spv::StorageClassWorkgroup, lds_type_id, "LDSTransposeScratch");
	}

	if (get_type_data_format(input_imm) != get_type_data_format(output_imm))
		return 0;
	if (get_type_data_format(input_imm) == AmdExtD3DShaderIntrinsicsWaveMatrixDataFormat_F32)
		return 0;

	spv::Id subgroup_id_var = impl.spirv_module.get_builtin_shader_input(spv::BuiltInSubgroupId);
	auto *subgroup_id = impl.allocate(spv::OpLoad, builder.makeUintType(32));
	subgroup_id->add_id(subgroup_id_var);
	impl.add(subgroup_id);

	auto *index = impl.allocate(spv::OpIMul, builder.makeUintType(32));
	index->add_id(subgroup_id->id);
	index->add_id(builder.makeUintConstant(16 * 16));
	impl.add(index);

	auto *chain = impl.allocate(spv::OpInBoundsAccessChain,
	                            builder.makePointer(spv::StorageClassWorkgroup, builder.makeUintType(32)));
	chain->add_id(impl.ags.coopmat_transpose_scratch);
	chain->add_id(index->id);
	impl.add(chain);

	auto *barrier = impl.allocate(spv::OpControlBarrier);
	barrier->add_id(builder.makeUintConstant(spv::ScopeSubgroup));
	barrier->add_id(builder.makeUintConstant(spv::ScopeWorkgroup));
	barrier->add_id(builder.makeUintConstant(spv::MemorySemanticsWorkgroupMemoryMask | spv::MemorySemanticsAcquireReleaseMask));
	impl.add(barrier);

	auto *store = impl.allocate(spv::OpCooperativeMatrixStoreKHR);
	store->add_id(chain->id);
	store->add_id(v);
	store->add_id(builder.makeUintConstant(spv::CooperativeMatrixLayoutColumnMajorKHR));
	store->add_id(builder.makeUintConstant(16));
	impl.add(store);

	barrier = impl.allocate(spv::OpControlBarrier);
	barrier->add_id(builder.makeUintConstant(spv::ScopeSubgroup));
	barrier->add_id(builder.makeUintConstant(spv::ScopeWorkgroup));
	barrier->add_id(builder.makeUintConstant(spv::MemorySemanticsWorkgroupMemoryMask | spv::MemorySemanticsAcquireReleaseMask));
	impl.add(barrier);

	spv::Id output_type = build_coopmat_type(impl, output_imm);
	if (!output_type)
		return 0;

	auto *load = impl.allocate(spv::OpCooperativeMatrixLoadKHR, output_type);
	load->add_id(chain->id);
	load->add_id(builder.makeUintConstant(spv::CooperativeMatrixLayoutColumnMajorKHR));
	load->add_id(builder.makeUintConstant(16));
	impl.add(load);

	return load->id;
}